

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_data.cpp
# Opt level: O0

void InitGLRMapinfoData(void)

{
  level_info_t *this;
  bool bVar1;
  int iVar2;
  TVector3<float> local_34;
  TVector3<float> local_28;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_1c;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_18;
  FName local_14;
  FGLROptions *local_10;
  FGLROptions *opt;
  
  this = level.info;
  FName::FName(&local_14,"gl_renderer");
  local_10 = level_info_t::GetOptData<FGLROptions>(this,&local_14,false);
  if (local_10 == (FGLROptions *)0x0) {
    PalEntry::PalEntry((PalEntry *)&local_1c.field_0,(level.info)->outsidefog);
    gl_SetFogParams(0,(PalEntry)local_1c,0,0);
    glset.map_lightmode = -1;
    glset.map_brightfog = -1;
    glset.map_nocoloredspritelighting = -1;
    glset.map_notexturefill = -1;
    TVector3<float>::TVector3(&local_28,0.0,0.0,1.0);
    TVector3<float>::operator=(&glset.skyrotatevector,&local_28);
    TVector3<float>::TVector3(&local_34,0.0,0.0,1.0);
    TVector3<float>::operator=(&glset.skyrotatevector2,&local_34);
    glset.pixelstretch = 1.2;
  }
  else {
    iVar2 = *(int *)&(local_10->super_FOptionalMapinfoData).field_0x14;
    PalEntry::PalEntry((PalEntry *)&local_18.field_0,(level.info)->outsidefog);
    gl_SetFogParams(iVar2,(PalEntry)local_18,local_10->outsidefogdensity,local_10->skyfog);
    glset.map_lightmode = (SBYTE)local_10->lightmode;
    glset.map_brightfog = (SBYTE)local_10->brightfog;
    glset.map_nocoloredspritelighting = local_10->nocoloredspritelighting;
    glset.map_notexturefill = local_10->notexturefill;
    TVector3<float>::operator=(&glset.skyrotatevector,&local_10->skyrotatevector);
    TVector3<float>::operator=(&glset.skyrotatevector2,&local_10->skyrotatevector2);
    glset.pixelstretch = local_10->pixelstretch;
  }
  bVar1 = IsLightmodeValid();
  if (bVar1) {
    glset.lightmode = glset.map_lightmode;
  }
  else {
    iVar2 = FIntCVar::operator_cast_to_int(&gl_lightmode);
    glset.lightmode = (SBYTE)iVar2;
  }
  if (glset.map_nocoloredspritelighting == -1) {
    glset.nocoloredspritelighting = FBoolCVar::operator_cast_to_bool(&gl_nocoloredspritelighting);
  }
  else {
    glset.nocoloredspritelighting = glset.map_nocoloredspritelighting != '\0';
  }
  if (glset.map_notexturefill == -1) {
    glset.notexturefill = FBoolCVar::operator_cast_to_bool(&gl_notexturefill);
  }
  else {
    glset.notexturefill = glset.map_notexturefill != '\0';
  }
  if (glset.map_brightfog == -1) {
    glset.brightfog = FBoolCVar::operator_cast_to_bool(&gl_brightfog);
  }
  else {
    glset.brightfog = glset.map_brightfog != '\0';
  }
  return;
}

Assistant:

void InitGLRMapinfoData()
{
	FGLROptions *opt = level.info->GetOptData<FGLROptions>("gl_renderer", false);

	if (opt != NULL)
	{
		gl_SetFogParams(opt->fogdensity, level.info->outsidefog, opt->outsidefogdensity, opt->skyfog);
		glset.map_lightmode = opt->lightmode;
		glset.map_brightfog = opt->brightfog;
		glset.map_nocoloredspritelighting = opt->nocoloredspritelighting;
		glset.map_notexturefill = opt->notexturefill;
		glset.skyrotatevector = opt->skyrotatevector;
		glset.skyrotatevector2 = opt->skyrotatevector2;
		glset.pixelstretch = opt->pixelstretch;
	}
	else
	{
		gl_SetFogParams(0, level.info->outsidefog, 0, 0);
		glset.map_lightmode = -1;
		glset.map_brightfog = -1;
		glset.map_nocoloredspritelighting = -1;
		glset.map_notexturefill = -1;
		glset.skyrotatevector = FVector3(0,0,1);
		glset.skyrotatevector2 = FVector3(0,0,1);
		glset.pixelstretch = 1.2f;
	}

	if (!IsLightmodeValid()) glset.lightmode = gl_lightmode;
	else glset.lightmode = glset.map_lightmode;
	if (glset.map_nocoloredspritelighting == -1) glset.nocoloredspritelighting = gl_nocoloredspritelighting;
	else glset.nocoloredspritelighting = !!glset.map_nocoloredspritelighting;
	if (glset.map_notexturefill == -1) glset.notexturefill = gl_notexturefill;
	else glset.notexturefill = !!glset.map_notexturefill;
	if (glset.map_brightfog == -1) glset.brightfog = gl_brightfog;
	else glset.brightfog = !!glset.map_brightfog;
}